

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O2

int Test_SUNSparseMatrixToCSC(SUNMatrix A)

{
  int iVar1;
  SUNMatrix p_Var2;
  SUNMatrix csr;
  SUNMatrix csc;
  
  csc = (SUNMatrix)0x0;
  csr = (SUNMatrix)0x0;
  iVar1 = SUNSparseMatrix_ToCSC();
  if (iVar1 == 0) {
    iVar1 = SUNSparseMatrix_ToCSR(csc,&csr);
    if (iVar1 == 0) {
      iVar1 = check_matrix(A,csr,4.440892098500626e-14);
      if (iVar1 == 0) {
        puts("    PASSED test -- SUNSparseMatrixToCSC");
        SUNMatDestroy(csr);
        iVar1 = 0;
        p_Var2 = csc;
        goto LAB_00103cde;
      }
      puts(">>> FAILED test --  Test_SUNSparseMatrixToCSC check_martrix failed");
      SUNMatDestroy(csr);
    }
    else {
      puts(">>> FAILED test -- SUNSparseMatrix_ToCSR returned nonzero");
    }
    iVar1 = 1;
    p_Var2 = csc;
  }
  else {
    puts(">>> FAILED test -- SUNSparseMatrix_ToCSC returned nonzero");
    iVar1 = 1;
    p_Var2 = (SUNMatrix)0x0;
  }
LAB_00103cde:
  SUNMatDestroy(p_Var2);
  return iVar1;
}

Assistant:

int Test_SUNSparseMatrixToCSC(SUNMatrix A)
{
  int failure;
  SUNMatrix csc = NULL, csr = NULL;
  sunrealtype tol = 200 * SUN_UNIT_ROUNDOFF;

  failure = SUNSparseMatrix_ToCSC(A, &csc);

  if (failure)
  {
    printf(">>> FAILED test -- SUNSparseMatrix_ToCSC returned nonzero\n");
    SUNMatDestroy(csr);
    return (1);
  }

  /* check entries */
  if (SUNSparseMatrix_ToCSR(csc, &csr))
  {
    printf(">>> FAILED test -- SUNSparseMatrix_ToCSR returned nonzero\n");
    SUNMatDestroy(csc);
    return (1);
  }

  if (check_matrix(A, csr, tol))
  {
    printf(
      ">>> FAILED test --  Test_SUNSparseMatrixToCSC check_martrix failed\n");
    SUNMatDestroy(csr);
    SUNMatDestroy(csc);
    return (1);
  }

  printf("    PASSED test -- SUNSparseMatrixToCSC\n");

  SUNMatDestroy(csr);
  SUNMatDestroy(csc);

  return (0);
}